

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

void __thiscall cppcms::impl::service::service(service *this)

{
  noncopyable *in_RDI;
  noncopyable *this_00;
  unique_ptr<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
  *in_stack_ffffffffffffff60;
  
  booster::noncopyable::noncopyable(in_RDI);
  std::unique_ptr<booster::aio::io_service,std::default_delete<booster::aio::io_service>>::
  unique_ptr<std::default_delete<booster::aio::io_service>,void>(in_stack_ffffffffffffff60);
  this_00 = in_RDI + 8;
  std::
  vector<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
  ::vector((vector<std::shared_ptr<cppcms::impl::cgi::acceptor>,_std::allocator<std::shared_ptr<cppcms::impl::cgi::acceptor>_>_>
            *)0x3679de);
  std::
  unique_ptr<cppcms::impl::prefork_acceptor,std::default_delete<cppcms::impl::prefork_acceptor>>::
  unique_ptr<std::default_delete<cppcms::impl::prefork_acceptor>,void>
            ((unique_ptr<cppcms::impl::prefork_acceptor,_std::default_delete<cppcms::impl::prefork_acceptor>_>
              *)this_00);
  std::unique_ptr<cppcms::json::value,std::default_delete<cppcms::json::value>>::
  unique_ptr<std::default_delete<cppcms::json::value>,void>
            ((unique_ptr<cppcms::json::value,_std::default_delete<cppcms::json::value>_> *)this_00);
  std::unique_ptr<cppcms::applications_pool,std::default_delete<cppcms::applications_pool>>::
  unique_ptr<std::default_delete<cppcms::applications_pool>,void>
            ((unique_ptr<cppcms::applications_pool,_std::default_delete<cppcms::applications_pool>_>
              *)this_00);
  std::unique_ptr<cppcms::thread_pool,std::default_delete<cppcms::thread_pool>>::
  unique_ptr<std::default_delete<cppcms::thread_pool>,void>
            ((unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_> *)this_00);
  std::unique_ptr<booster::locale::generator,std::default_delete<booster::locale::generator>>::
  unique_ptr<std::default_delete<booster::locale::generator>,void>
            ((unique_ptr<booster::locale::generator,_std::default_delete<booster::locale::generator>_>
              *)this_00);
  std::unique_ptr<cppcms::views::manager,std::default_delete<cppcms::views::manager>>::
  unique_ptr<std::default_delete<cppcms::views::manager>,void>
            ((unique_ptr<cppcms::views::manager,_std::default_delete<cppcms::views::manager>_> *)
             this_00);
  std::unique_ptr<cppcms::cache_pool,std::default_delete<cppcms::cache_pool>>::
  unique_ptr<std::default_delete<cppcms::cache_pool>,void>
            ((unique_ptr<cppcms::cache_pool,_std::default_delete<cppcms::cache_pool>_> *)this_00);
  std::unique_ptr<cppcms::session_pool,std::default_delete<cppcms::session_pool>>::
  unique_ptr<std::default_delete<cppcms::session_pool>,void>
            ((unique_ptr<cppcms::session_pool,_std::default_delete<cppcms::session_pool>_> *)this_00
            );
  std::unique_ptr<cppcms::forwarder,std::default_delete<cppcms::forwarder>>::
  unique_ptr<std::default_delete<cppcms::forwarder>,void>
            ((unique_ptr<cppcms::forwarder,_std::default_delete<cppcms::forwarder>_> *)this_00);
  std::unique_ptr<cppcms::impl::cached_settings,std::default_delete<cppcms::impl::cached_settings>>
  ::unique_ptr<std::default_delete<cppcms::impl::cached_settings>,void>
            ((unique_ptr<cppcms::impl::cached_settings,_std::default_delete<cppcms::impl::cached_settings>_>
              *)this_00);
  std::locale::locale((locale *)(in_RDI + 0x70));
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x367ae6);
  std::unique_ptr<booster::aio::stream_socket,std::default_delete<booster::aio::stream_socket>>::
  unique_ptr<std::default_delete<booster::aio::stream_socket>,void>
            ((unique_ptr<booster::aio::stream_socket,_std::default_delete<booster::aio::stream_socket>_>
              *)this_00);
  std::unique_ptr<booster::aio::stream_socket,std::default_delete<booster::aio::stream_socket>>::
  unique_ptr<std::default_delete<booster::aio::stream_socket>,void>
            ((unique_ptr<booster::aio::stream_socket,_std::default_delete<booster::aio::stream_socket>_>
              *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x367b34);
  booster::hold_ptr<cppcms::plugin::scope>::hold_ptr
            ((hold_ptr<cppcms::plugin::scope> *)(in_RDI + 0xc0));
  return;
}

Assistant:

service::service() 
	{
	}